

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

void sortAndUnique(word **a,Abc_TtStore_t *p)

{
  int iVar1;
  word *__s1;
  int iVar2;
  long lVar3;
  int iVar4;
  word *__s2;
  
  iVar1 = p->nFuncs;
  qsort(a,(long)iVar1,8,compareWords3);
  __s2 = *a;
  iVar4 = 1;
  for (lVar3 = 1; lVar3 < iVar1; lVar3 = lVar3 + 1) {
    __s1 = a[lVar3];
    iVar2 = bcmp(__s1,__s2,(long)p->nWords << 3);
    if (iVar2 != 0) {
      a[iVar4] = __s1;
      __s2 = a[lVar3];
      iVar4 = iVar4 + 1;
    }
  }
  p->nFuncs = iVar4;
  return;
}

Assistant:

void sortAndUnique(word** a, Abc_TtStore_t* p)
{
     int i, count=1, WordsPtrN = p->nFuncs;
     word* tempWordPtr;
     qsort(a,WordsPtrN,sizeof(word*),(int(*)(const void *,const void *))compareWords3);
     tempWordPtr = a[0];
     for(i=1;i<WordsPtrN;i++)   
         if(memcmp(a[i],tempWordPtr,sizeof(word)*(p->nWords)) != 0)
         {
             a[count] = a[i];
             tempWordPtr = a[i];
             count++;
         }
         p->nFuncs = count;
}